

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O0

void VSInterface::RegisterFilter<TMedian>(VSRegisterFunction registerFunc,VSPlugin *vsplugin)

{
  char *pcVar1;
  char *pcVar2;
  string local_d0;
  undefined1 local_b0 [8];
  TMedian filter;
  VSPlugin *vsplugin_local;
  VSRegisterFunction registerFunc_local;
  
  filter.tmedian_SIMD = (_func_void_int_uchar_ptr_ptr_uchar_ptr_int_int_int *)vsplugin;
  TMedian::TMedian((TMedian *)local_b0);
  pcVar1 = TMedian::VSName((TMedian *)local_b0);
  Filter::VSParams_abi_cxx11_(&local_d0,(Filter *)local_b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  (*registerFunc)(pcVar1,pcVar2,Create<TMedian>,(void *)0x0,(VSPlugin *)filter.tmedian_SIMD);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void RegisterFilter(VSRegisterFunction registerFunc, VSPlugin* vsplugin) {
    FilterType filter;
    registerFunc(filter.VSName(), filter.VSParams().c_str(), Create<FilterType>, nullptr, vsplugin);
  }